

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O2

void Shell::Shuffling::
     shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
               (DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *a,
               uint len)

{
  undefined8 *puVar1;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *ppVar2;
  List<unsigned_int> *pLVar3;
  List<Kernel::TermList> *pLVar4;
  List<Kernel::TermList> *pLVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  lVar8 = 0;
  iVar7 = 0;
  uVar9 = (ulong)len;
  while (uVar9 != 0) {
    iVar6 = Lib::Random::getInteger((int)uVar9);
    ppVar2 = a->_array;
    puVar1 = (undefined8 *)((long)&ppVar2->first + lVar8);
    pLVar3 = (List<unsigned_int> *)*puVar1;
    pLVar4 = (List<Kernel::TermList> *)puVar1[1];
    pLVar5 = ppVar2[(uint)(iVar6 + iVar7)].second;
    puVar1 = (undefined8 *)((long)&ppVar2->first + lVar8);
    *puVar1 = ppVar2[(uint)(iVar6 + iVar7)].first;
    puVar1[1] = pLVar5;
    ppVar2[(uint)(iVar6 + iVar7)].first = pLVar3;
    ppVar2[(uint)(iVar6 + iVar7)].second = pLVar4;
    iVar7 = iVar7 + 1;
    lVar8 = lVar8 + 0x10;
    uVar9 = uVar9 - 1;
  }
  return;
}

Assistant:

static void shuffleArray(Arrayish& a, unsigned len) {
    for(unsigned i=0;i<len;i++){
      unsigned j = Random::getInteger(len-i)+i;
      std::swap(a[i],a[j]);
    }
  }